

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_api_test.cc
# Opt level: O0

aom_image_t * anon_unknown.dwarf_a078f1::CreateGrayImage(aom_img_fmt_t fmt,uint w,uint h)

{
  uint uVar1;
  uint uVar2;
  aom_image_t *paVar3;
  uint in_ESI;
  uint in_EDI;
  aom_image_t *unaff_retaddr;
  uint i_1;
  uint uv_w;
  uint uv_h;
  uint i;
  aom_image_t *image;
  uint local_30;
  uint local_24;
  undefined8 in_stack_fffffffffffffff8;
  
  paVar3 = aom_img_alloc(unaff_retaddr,(aom_img_fmt_t)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                         (uint)in_stack_fffffffffffffff8,in_EDI,in_ESI);
  if (paVar3 != (aom_image_t *)0x0) {
    for (local_24 = 0; local_24 < paVar3->d_h; local_24 = local_24 + 1) {
      memset(paVar3->planes[0] + local_24 * paVar3->stride[0],0x80,(ulong)paVar3->d_w);
    }
    uVar1 = paVar3->d_h;
    uVar2 = paVar3->d_w + 1 >> 1;
    for (local_30 = 0; local_30 < uVar1 + 1 >> 1; local_30 = local_30 + 1) {
      memset(paVar3->planes[1] + local_30 * paVar3->stride[1],0x80,(ulong)uVar2);
      memset(paVar3->planes[2] + local_30 * paVar3->stride[2],0x80,(ulong)uVar2);
    }
  }
  return paVar3;
}

Assistant:

aom_image_t *CreateGrayImage(aom_img_fmt_t fmt, unsigned int w,
                             unsigned int h) {
  aom_image_t *const image = aom_img_alloc(nullptr, fmt, w, h, 1);
  if (!image) return image;

  for (unsigned int i = 0; i < image->d_h; ++i) {
    memset(image->planes[0] + i * image->stride[0], 128, image->d_w);
  }
  const unsigned int uv_h = (image->d_h + 1) / 2;
  const unsigned int uv_w = (image->d_w + 1) / 2;
  for (unsigned int i = 0; i < uv_h; ++i) {
    memset(image->planes[1] + i * image->stride[1], 128, uv_w);
    memset(image->planes[2] + i * image->stride[2], 128, uv_w);
  }
  return image;
}